

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O0

void __thiscall sjtu::exception::exception(exception *this)

{
  undefined8 *in_RDI;
  allocator local_1d [20];
  allocator local_9 [9];
  
  *in_RDI = &PTR_what_abi_cxx11__00137898;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 1),"",local_9);
  std::allocator<char>::~allocator((allocator<char> *)local_9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 5),"",local_1d);
  std::allocator<char>::~allocator((allocator<char> *)local_1d);
  return;
}

Assistant:

exception() {}